

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5UnicodeCatParse(char *zCat,u8 *aArray)

{
  char cVar1;
  u8 *aArray_local;
  char *zCat_local;
  
  *aArray = '\x01';
  switch(*zCat) {
  case 'C':
    cVar1 = zCat[1];
    if (cVar1 == '*') {
      builtin_memcpy(aArray + 1,"\x01\x01\x01\x01",4);
      aArray[0x1f] = '\x01';
    }
    else if (cVar1 == 'c') {
      aArray[1] = '\x01';
    }
    else if (cVar1 == 'f') {
      aArray[2] = '\x01';
    }
    else if (cVar1 == 'n') {
      aArray[3] = '\x01';
    }
    else if (cVar1 == 'o') {
      aArray[0x1f] = '\x01';
    }
    else {
      if (cVar1 != 's') {
        return 1;
      }
      aArray[4] = '\x01';
    }
    break;
  case 'L':
    cVar1 = zCat[1];
    if (cVar1 == '*') {
      builtin_memcpy(aArray + 5,"\x01\x01\x01\x01\x01",5);
      aArray[0x1e] = '\x01';
    }
    else if (cVar1 == 'C') {
      aArray[0x1e] = '\x01';
    }
    else if (cVar1 == 'l') {
      aArray[5] = '\x01';
    }
    else if (cVar1 == 'm') {
      aArray[6] = '\x01';
    }
    else if (cVar1 == 'o') {
      aArray[7] = '\x01';
    }
    else if (cVar1 == 't') {
      aArray[8] = '\x01';
    }
    else {
      if (cVar1 != 'u') {
        return 1;
      }
      aArray[9] = '\x01';
    }
    break;
  case 'M':
    cVar1 = zCat[1];
    if (cVar1 == '*') {
      aArray[10] = '\x01';
      aArray[0xb] = '\x01';
      aArray[0xc] = '\x01';
    }
    else if (cVar1 == 'c') {
      aArray[10] = '\x01';
    }
    else if (cVar1 == 'e') {
      aArray[0xb] = '\x01';
    }
    else {
      if (cVar1 != 'n') {
        return 1;
      }
      aArray[0xc] = '\x01';
    }
    break;
  case 'N':
    cVar1 = zCat[1];
    if (cVar1 == '*') {
      aArray[0xd] = '\x01';
      aArray[0xe] = '\x01';
      aArray[0xf] = '\x01';
    }
    else if (cVar1 == 'd') {
      aArray[0xd] = '\x01';
    }
    else if (cVar1 == 'l') {
      aArray[0xe] = '\x01';
    }
    else {
      if (cVar1 != 'o') {
        return 1;
      }
      aArray[0xf] = '\x01';
    }
    break;
  case 'P':
    switch(zCat[1]) {
    case '*':
      builtin_memcpy(aArray + 0x10,"\x01\x01\x01\x01\x01\x01\x01",7);
      break;
    default:
      return 1;
    case 'c':
      aArray[0x10] = '\x01';
      break;
    case 'd':
      aArray[0x11] = '\x01';
      break;
    case 'e':
      aArray[0x12] = '\x01';
      break;
    case 'f':
      aArray[0x13] = '\x01';
      break;
    case 'i':
      aArray[0x14] = '\x01';
      break;
    case 'o':
      aArray[0x15] = '\x01';
      break;
    case 's':
      aArray[0x16] = '\x01';
    }
    break;
  case 'S':
    cVar1 = zCat[1];
    if (cVar1 == '*') {
      builtin_memcpy(aArray + 0x17,"\x01\x01\x01\x01",4);
    }
    else if (cVar1 == 'c') {
      aArray[0x17] = '\x01';
    }
    else if (cVar1 == 'k') {
      aArray[0x18] = '\x01';
    }
    else if (cVar1 == 'm') {
      aArray[0x19] = '\x01';
    }
    else {
      if (cVar1 != 'o') {
        return 1;
      }
      aArray[0x1a] = '\x01';
    }
    break;
  case 'Z':
    cVar1 = zCat[1];
    if (cVar1 == '*') {
      aArray[0x1b] = '\x01';
      aArray[0x1c] = '\x01';
      aArray[0x1d] = '\x01';
    }
    else if (cVar1 == 'l') {
      aArray[0x1b] = '\x01';
    }
    else if (cVar1 == 'p') {
      aArray[0x1c] = '\x01';
    }
    else {
      if (cVar1 != 's') {
        return 1;
      }
      aArray[0x1d] = '\x01';
    }
  }
  return 0;
}

Assistant:

static int sqlite3Fts5UnicodeCatParse(const char *zCat, u8 *aArray){ 
  aArray[0] = 1;
  switch( zCat[0] ){
    case 'C':
          switch( zCat[1] ){
            case 'c': aArray[1] = 1; break;
            case 'f': aArray[2] = 1; break;
            case 'n': aArray[3] = 1; break;
            case 's': aArray[4] = 1; break;
            case 'o': aArray[31] = 1; break;
            case '*': 
              aArray[1] = 1;
              aArray[2] = 1;
              aArray[3] = 1;
              aArray[4] = 1;
              aArray[31] = 1;
              break;
            default: return 1;          }
          break;

    case 'L':
          switch( zCat[1] ){
            case 'l': aArray[5] = 1; break;
            case 'm': aArray[6] = 1; break;
            case 'o': aArray[7] = 1; break;
            case 't': aArray[8] = 1; break;
            case 'u': aArray[9] = 1; break;
            case 'C': aArray[30] = 1; break;
            case '*': 
              aArray[5] = 1;
              aArray[6] = 1;
              aArray[7] = 1;
              aArray[8] = 1;
              aArray[9] = 1;
              aArray[30] = 1;
              break;
            default: return 1;          }
          break;

    case 'M':
          switch( zCat[1] ){
            case 'c': aArray[10] = 1; break;
            case 'e': aArray[11] = 1; break;
            case 'n': aArray[12] = 1; break;
            case '*': 
              aArray[10] = 1;
              aArray[11] = 1;
              aArray[12] = 1;
              break;
            default: return 1;          }
          break;

    case 'N':
          switch( zCat[1] ){
            case 'd': aArray[13] = 1; break;
            case 'l': aArray[14] = 1; break;
            case 'o': aArray[15] = 1; break;
            case '*': 
              aArray[13] = 1;
              aArray[14] = 1;
              aArray[15] = 1;
              break;
            default: return 1;          }
          break;

    case 'P':
          switch( zCat[1] ){
            case 'c': aArray[16] = 1; break;
            case 'd': aArray[17] = 1; break;
            case 'e': aArray[18] = 1; break;
            case 'f': aArray[19] = 1; break;
            case 'i': aArray[20] = 1; break;
            case 'o': aArray[21] = 1; break;
            case 's': aArray[22] = 1; break;
            case '*': 
              aArray[16] = 1;
              aArray[17] = 1;
              aArray[18] = 1;
              aArray[19] = 1;
              aArray[20] = 1;
              aArray[21] = 1;
              aArray[22] = 1;
              break;
            default: return 1;          }
          break;

    case 'S':
          switch( zCat[1] ){
            case 'c': aArray[23] = 1; break;
            case 'k': aArray[24] = 1; break;
            case 'm': aArray[25] = 1; break;
            case 'o': aArray[26] = 1; break;
            case '*': 
              aArray[23] = 1;
              aArray[24] = 1;
              aArray[25] = 1;
              aArray[26] = 1;
              break;
            default: return 1;          }
          break;

    case 'Z':
          switch( zCat[1] ){
            case 'l': aArray[27] = 1; break;
            case 'p': aArray[28] = 1; break;
            case 's': aArray[29] = 1; break;
            case '*': 
              aArray[27] = 1;
              aArray[28] = 1;
              aArray[29] = 1;
              break;
            default: return 1;          }
          break;

  }
  return 0;
}